

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O0

void Gia_ManFraSupports(Gia_ManFra_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  int *piVar4;
  Vec_Int_t *vNodes;
  bool bVar5;
  int local_38;
  int local_34;
  int i;
  int f;
  Gia_Obj_t *pObj;
  Vec_Int_t *vOuts;
  Vec_Int_t *vAnds;
  Vec_Int_t *vIns;
  Gia_ManFra_t *p_local;
  
  vAnds = (Vec_Int_t *)0x0;
  pVVar3 = Vec_PtrStart(p->pPars->nFrames);
  p->vIns = pVVar3;
  pVVar3 = Vec_PtrStart(p->pPars->nFrames);
  p->vAnds = pVVar3;
  pVVar3 = Vec_PtrStart(p->pPars->nFrames);
  p->vOuts = pVVar3;
  Gia_ManIncrementTravId(p->pAig);
  local_34 = p->pPars->nFrames;
  while (local_34 = local_34 + -1, -1 < local_34) {
    p_00 = Gia_ManCollectPoIds(p->pAig);
    if (vAnds != (Vec_Int_t *)0x0) {
      local_38 = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vAnds);
        bVar5 = false;
        if (local_38 < iVar2) {
          pGVar1 = p->pAig;
          iVar2 = Vec_IntEntry(vAnds,local_38);
          _i = Gia_ManObj(pGVar1,iVar2);
          bVar5 = _i != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar2 = Gia_ObjIsRo(p->pAig,_i);
        if (iVar2 != 0) {
          pGVar1 = p->pAig;
          pObj_00 = Gia_ObjRoToRi(p->pAig,_i);
          iVar2 = Gia_ObjId(pGVar1,pObj_00);
          Vec_IntPush(p_00,iVar2);
        }
        local_38 = local_38 + 1;
      }
    }
    vAnds = Vec_IntAlloc(100);
    pGVar1 = p->pAig;
    piVar4 = Vec_IntArray(p_00);
    iVar2 = Vec_IntSize(p_00);
    Gia_ManCollectCis(pGVar1,piVar4,iVar2,vAnds);
    vNodes = Vec_IntAlloc(100);
    pGVar1 = p->pAig;
    piVar4 = Vec_IntArray(p_00);
    iVar2 = Vec_IntSize(p_00);
    Gia_ManCollectAnds(pGVar1,piVar4,iVar2,vNodes,(Vec_Int_t *)0x0);
    Vec_PtrWriteEntry(p->vIns,local_34,vAnds);
    Vec_PtrWriteEntry(p->vAnds,local_34,vNodes);
    Vec_PtrWriteEntry(p->vOuts,local_34,p_00);
  }
  return;
}

Assistant:

void Gia_ManFraSupports( Gia_ManFra_t * p )
{
    Vec_Int_t * vIns = NULL, * vAnds, * vOuts;
    Gia_Obj_t * pObj;
    int f, i;
    p->vIns  = Vec_PtrStart( p->pPars->nFrames );
    p->vAnds = Vec_PtrStart( p->pPars->nFrames );
    p->vOuts = Vec_PtrStart( p->pPars->nFrames );
    Gia_ManIncrementTravId( p->pAig );
    for ( f = p->pPars->nFrames - 1; f >= 0; f-- )
    {
        vOuts = Gia_ManCollectPoIds( p->pAig );
        if ( vIns )
        Gia_ManForEachObjVec( vIns, p->pAig, pObj, i )
            if ( Gia_ObjIsRo(p->pAig, pObj) )
                Vec_IntPush( vOuts, Gia_ObjId( p->pAig, Gia_ObjRoToRi(p->pAig, pObj) ) );
        vIns = Vec_IntAlloc( 100 );
        Gia_ManCollectCis( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vIns );
        vAnds = Vec_IntAlloc( 100 );
        Gia_ManCollectAnds( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vAnds, NULL );
        Vec_PtrWriteEntry( p->vIns,  f, vIns );
        Vec_PtrWriteEntry( p->vAnds, f, vAnds );
        Vec_PtrWriteEntry( p->vOuts, f, vOuts );
    }
}